

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O3

cbtVector3 ThreePlaneIntersection(cbtPlane *p0,cbtPlane *p1,cbtPlane *p2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  cbtVector3 cVar21;
  
  uVar4 = *(ulong *)(p2->normal).m_floats;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar4;
  fVar1 = (p1->normal).m_floats[2];
  fVar2 = (p2->normal).m_floats[2];
  uVar5 = *(ulong *)(p1->normal).m_floats;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar5;
  fVar3 = (p0->normal).m_floats[2];
  uVar6 = *(ulong *)(p0->normal).m_floats;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar6;
  auVar8 = vmovshdup_avx(auVar18);
  auVar7 = vinsertps_avx(ZEXT416((uint)fVar2),auVar18,0x1c);
  auVar14 = vmovshdup_avx(auVar17);
  auVar15 = vinsertps_avx(ZEXT416((uint)fVar1),auVar17,0x1c);
  auVar9 = vmovshdup_avx(auVar16);
  auVar20._0_4_ = auVar7._0_4_ * (float)uVar5;
  auVar20._4_4_ = auVar7._4_4_ * (float)(uVar5 >> 0x20);
  auVar20._8_4_ = auVar7._8_4_ * 0.0;
  auVar20._12_4_ = auVar7._12_4_ * 0.0;
  auVar10 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * fVar1)),auVar14,ZEXT416((uint)fVar2));
  auVar18 = vfmsub231ps_fma(auVar20,auVar15,auVar18);
  auVar20 = vfmsub231ss_fma(ZEXT416((uint)(auVar14._0_4_ * fVar3)),auVar9,ZEXT416((uint)fVar1));
  auVar14._0_4_ = auVar15._0_4_ * (float)uVar6;
  auVar14._4_4_ = auVar15._4_4_ * (float)(uVar6 >> 0x20);
  auVar14._8_4_ = auVar15._8_4_ * 0.0;
  auVar14._12_4_ = auVar15._12_4_ * 0.0;
  auVar13 = ZEXT416((uint)fVar3);
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar2)),auVar13,auVar8);
  auVar15 = vinsertps_avx(auVar13,auVar16,0x1c);
  auVar19._0_4_ = auVar15._0_4_ * (float)uVar4;
  auVar19._4_4_ = auVar15._4_4_ * (float)(uVar4 >> 0x20);
  auVar19._8_4_ = auVar15._8_4_ * 0.0;
  auVar19._12_4_ = auVar15._12_4_ * 0.0;
  auVar8 = vfmsub231ps_fma(auVar14,auVar15,auVar17);
  fVar1 = p1->dist;
  auVar14 = vfmsub231ps_fma(auVar19,auVar16,auVar7);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar18._0_4_)),auVar10,auVar16);
  auVar7 = vmovshdup_avx(auVar18);
  auVar7 = vfmadd213ss_fma(auVar7,auVar13,auVar15);
  fVar2 = p0->dist;
  fVar12 = -1.0 / auVar7._0_4_;
  fVar3 = p2->dist;
  auVar15._0_4_ = (auVar8._0_4_ * fVar3 + auVar18._0_4_ * fVar2 + auVar14._0_4_ * fVar1) * fVar12;
  auVar15._4_4_ = (auVar8._4_4_ * fVar3 + auVar18._4_4_ * fVar2 + auVar14._4_4_ * fVar1) * fVar12;
  auVar15._8_4_ = (auVar8._8_4_ * fVar3 + auVar18._8_4_ * fVar2 + auVar14._8_4_ * fVar1) * fVar12;
  auVar15._12_4_ =
       (auVar8._12_4_ * fVar3 + auVar18._12_4_ * fVar2 + auVar14._12_4_ * fVar1) * fVar12;
  auVar7 = vinsertps_avx(ZEXT416((uint)((auVar20._0_4_ * fVar3 +
                                        fVar2 * auVar10._0_4_ + fVar1 * auVar11._0_4_) * fVar12)),
                         auVar15,0x1c);
  auVar15 = vinsertps_avx(auVar7,auVar15,0x4e);
  cVar21.m_floats._0_8_ = auVar7._0_8_;
  cVar21.m_floats._8_8_ = auVar15._0_8_;
  return (cbtVector3)cVar21.m_floats;
}

Assistant:

cbtVector3 ThreePlaneIntersection(const cbtPlane &p0, const cbtPlane &p1, const cbtPlane &p2)
{
	cbtVector3 N1 = p0.normal;
	cbtVector3 N2 = p1.normal;
	cbtVector3 N3 = p2.normal;

	cbtVector3 n2n3;
	n2n3 = N2.cross(N3);
	cbtVector3 n3n1;
	n3n1 = N3.cross(N1);
	cbtVector3 n1n2;
	n1n2 = N1.cross(N2);

	cbtScalar quotient = (N1.dot(n2n3));

	cbtAssert(cbtFabs(quotient) > cbtScalar(0.000001));

	quotient = cbtScalar(-1.) / quotient;
	n2n3 *= p0.dist;
	n3n1 *= p1.dist;
	n1n2 *= p2.dist;
	cbtVector3 potentialVertex = n2n3;
	potentialVertex += n3n1;
	potentialVertex += n1n2;
	potentialVertex *= quotient;

	cbtVector3 result(potentialVertex.getX(), potentialVertex.getY(), potentialVertex.getZ());
	return result;
}